

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundComparisonExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  DataChunk *this_00;
  optional_ptr<const_duckdb::SelectionVector,_true> sel_00;
  ExpressionExecutor *this_01;
  reference result;
  type pEVar1;
  reference pvVar2;
  idx_t iVar3;
  InternalException *this_02;
  reference pvVar4;
  reference result_00;
  allocator local_71;
  optional_ptr<const_duckdb::SelectionVector,_true> local_70;
  reference local_68;
  ExpressionExecutor *local_60;
  idx_t local_58;
  string local_50;
  
  this_00 = &state->intermediate_chunk;
  local_70.ptr = sel;
  local_60 = this;
  local_58 = count;
  DataChunk::Reset(this_00);
  result = vector<duckdb::Vector,_true>::get<true>(&this_00->data,0);
  local_68 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->left);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::get<true>(&state->child_states,0);
  iVar3 = local_58;
  this_01 = local_60;
  result_00 = local_68;
  Execute(local_60,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,local_58,result)
  ;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->right);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::get<true>(&state->child_states,1);
  sel_00.ptr = local_70.ptr;
  Execute(this_01,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,local_70.ptr,iVar3,
          result_00);
  switch((expr->super_Expression).super_BaseExpression.type) {
  case COMPARE_BOUNDARY_START:
    iVar3 = VectorOperations::Equals
                      (result,result_00,sel_00,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  case COMPARE_NOTEQUAL:
    iVar3 = VectorOperations::NotEquals
                      (result,result_00,sel_00,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  case COMPARE_LESSTHAN:
    pvVar4 = result;
    break;
  case COMPARE_GREATERTHAN:
    pvVar4 = result_00;
    result_00 = result;
    break;
  case COMPARE_LESSTHANOREQUALTO:
    pvVar4 = result;
    goto LAB_01387ee9;
  case COMPARE_GREATERTHANOREQUALTO:
    pvVar4 = result_00;
    result_00 = result;
LAB_01387ee9:
    iVar3 = TemplatedSelectOperation<duckdb::GreaterThanEquals>
                      (result_00,pvVar4,sel_00,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                       (optional_ptr<duckdb::ValidityMask,_true>)0x0);
    return iVar3;
  default:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_50,"Unknown comparison type!",&local_71);
    InternalException::InternalException(this_02,&local_50);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case COMPARE_DISTINCT_FROM:
    iVar3 = VectorOperations::DistinctFrom
                      (result,result_00,sel_00,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel);
    return iVar3;
  case COMPARE_BOUNDARY_END:
    iVar3 = VectorOperations::NotDistinctFrom
                      (result,result_00,sel_00,iVar3,
                       (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                       (optional_ptr<duckdb::SelectionVector,_true>)false_sel);
    return iVar3;
  }
  iVar3 = TemplatedSelectOperation<duckdb::GreaterThan>
                    (result_00,pvVar4,sel_00,iVar3,
                     (optional_ptr<duckdb::SelectionVector,_true>)true_sel,
                     (optional_ptr<duckdb::SelectionVector,_true>)false_sel,
                     (optional_ptr<duckdb::ValidityMask,_true>)0x0);
  return iVar3;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundComparisonExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
                                 SelectionVector *false_sel) {
	// resolve the children
	state->intermediate_chunk.Reset();
	auto &left = state->intermediate_chunk.data[0];
	auto &right = state->intermediate_chunk.data[1];

	Execute(*expr.left, state->child_states[0].get(), sel, count, left);
	Execute(*expr.right, state->child_states[1].get(), sel, count, right);

	switch (expr.GetExpressionType()) {
	case ExpressionType::COMPARE_EQUAL:
		return VectorOperations::Equals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_NOTEQUAL:
		return VectorOperations::NotEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_LESSTHAN:
		return VectorOperations::LessThan(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_GREATERTHAN:
		return VectorOperations::GreaterThan(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return VectorOperations::LessThanEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return VectorOperations::GreaterThanEquals(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return VectorOperations::DistinctFrom(left, right, sel, count, true_sel, false_sel);
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		return VectorOperations::NotDistinctFrom(left, right, sel, count, true_sel, false_sel);
	default:
		throw InternalException("Unknown comparison type!");
	}
}